

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O0

void DestroyInternal(OPTIONHANDLER_HANDLE handle)

{
  OPTION *pOVar1;
  undefined8 *puVar2;
  OPTION *option;
  size_t i;
  size_t nOptions;
  OPTIONHANDLER_HANDLE handle_local;
  
  if (handle != (OPTIONHANDLER_HANDLE)0x0) {
    pOVar1 = (OPTION *)VECTOR_size(handle->storage);
    for (option = (OPTION *)0x0; option < pOVar1; option = (OPTION *)((long)&option->name + 1)) {
      puVar2 = (undefined8 *)VECTOR_element(handle->storage,(size_t)option);
      if (puVar2 != (undefined8 *)0x0) {
        (*handle->destroyOption)((char *)*puVar2,(void *)puVar2[1]);
        free((void *)*puVar2);
      }
    }
    VECTOR_destroy(handle->storage);
    free(handle);
  }
  return;
}

Assistant:

static void DestroyInternal(OPTIONHANDLER_HANDLE handle)
{
    if (handle != NULL)
    {
        /*Codes_SRS_OPTIONHANDLER_02_016: [ Otherwise, OptionHandler_Destroy shall free all used resources. ]*/
        size_t nOptions = VECTOR_size(handle->storage), i;
        for (i = 0; i < nOptions; i++)
        {
            OPTION* option = (OPTION*)VECTOR_element(handle->storage, i);
            if (option != NULL)
            {
                handle->destroyOption(option->name, option->storage);
                free((void*)option->name);
            }
        }

        VECTOR_destroy(handle->storage);
        free(handle);
    }
}